

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

uint32_t __thiscall Cache::getTag(Cache *this,uint32_t addr)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  ulong uVar4;
  char cVar5;
  
  uVar2 = (this->policy).blockSize;
  cVar3 = -1;
  if (uVar2 != 0) {
    cVar3 = '\0';
    if ((uVar2 != 1) && (cVar3 = '\0', 1 < uVar2)) {
      cVar3 = '\0';
      do {
        cVar3 = cVar3 + '\x01';
        bVar1 = 3 < uVar2;
        uVar2 = uVar2 >> 1;
      } while (bVar1);
    }
  }
  uVar4 = (ulong)(this->policy).blockNum / (ulong)(this->policy).associativity;
  uVar2 = (uint)uVar4;
  cVar5 = -1;
  if (uVar2 != 0) {
    cVar5 = '\0';
    if ((uVar2 != 1) && (cVar5 = '\0', 1 < uVar2)) {
      cVar5 = '\0';
      do {
        cVar5 = cVar5 + '\x01';
        uVar2 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
      } while (3 < uVar2);
    }
  }
  return addr >> (cVar5 + cVar3 & 0x1fU) & ~(-1 << (-(cVar5 + cVar3) & 0x1fU));
}

Assistant:

uint32_t Cache::getTag(uint32_t addr) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  uint32_t mask = (1 << (32 - offsetBits - idBits)) - 1;
  return (addr >> (offsetBits + idBits)) & mask;
}